

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_291c47::ArgParser::argJsonHelp(ArgParser *this,string *parameter)

{
  bool bVar1;
  ulong uVar2;
  char *str;
  element_type *peVar3;
  element_type *this_00;
  Pipeline *this_01;
  int version_00;
  string local_b8;
  shared_ptr<QPDFLogger> local_98;
  QPDFLogger local_88 [2];
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint local_1c;
  string *psStack_18;
  int version;
  string *parameter_local;
  ArgParser *this_local;
  
  local_1c = 2;
  psStack_18 = parameter;
  parameter_local = (string *)this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = std::operator==(psStack_18,"latest");
    if (!bVar1) {
      str = (char *)std::__cxx11::string::c_str();
      local_1c = QUtil::string_to_int(str);
    }
  }
  if (((int)local_1c < 1) || (2 < (int)local_1c)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"unsupported json version ",&local_61);
    std::operator+(&local_40,&local_60,psStack_18);
    usage(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  QPDFLogger::defaultLogger();
  peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_98);
  QPDFLogger::getInfo(local_88,SUB81(peVar3,0));
  this_00 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                      ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_88);
  QPDFJob::json_out_schema_abi_cxx11_(&local_b8,(QPDFJob *)(ulong)local_1c,version_00);
  this_01 = Pipeline::operator<<(this_00,&local_b8);
  Pipeline::operator<<(this_01,"\n");
  std::__cxx11::string::~string((string *)&local_b8);
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)local_88);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&local_98);
  return;
}

Assistant:

void
ArgParser::argJsonHelp(std::string const& parameter)
{
    int version = JSON::LATEST;
    if (!(parameter.empty() || (parameter == "latest"))) {
        version = QUtil::string_to_int(parameter.c_str());
    }
    if ((version < 1) || (version > JSON::LATEST)) {
        usage(std::string("unsupported json version ") + parameter);
    }
    *QPDFLogger::defaultLogger()->getInfo() << QPDFJob::json_out_schema(version) << "\n";
}